

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O3

ParquetUUIDTargetType __thiscall
duckdb::ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
          (ParquetUUIDOperator *this,hugeint_t input)

{
  char cVar1;
  byte bVar5;
  byte bVar9;
  short sVar11;
  ushort uVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  unkbyte10 Var17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [14];
  undefined1 auVar20 [12];
  undefined1 auVar21 [14];
  ulong uVar22;
  undefined4 uVar23;
  short sVar24;
  ulong uVar25;
  undefined1 uVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  undefined1 auVar30 [16];
  ulong uVar31;
  undefined1 auVar32 [14];
  undefined1 auVar33 [16];
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [14];
  ulong uVar37;
  ulong uVar38;
  ParquetUUIDTargetType PVar39;
  byte bVar2;
  byte bVar3;
  char cVar4;
  byte bVar6;
  char cVar7;
  char cVar8;
  byte bVar10;
  
  uVar25 = input.lower ^ 0x8000000000000000;
  uVar26 = (undefined1)(uVar25 >> 0x38);
  auVar30._0_8_ = uVar25 >> 8;
  auVar30._8_8_ = uVar25;
  auVar30 = auVar30 & _DAT_003b43b0;
  uVar35 = (ulong)DAT_003b43b0;
  uVar22 = CONCAT14(uVar26,input.lower._3_4_) & uVar35;
  uVar38 = DAT_003b43b0._8_8_;
  uVar31 = CONCAT15(uVar26,input.lower._2_5_) & uVar38;
  cVar27 = (char)(uVar31 >> 0x10);
  cVar28 = (char)(uVar31 >> 0x20);
  Var17 = CONCAT19((char)(uVar31 >> 8),CONCAT18((char)uVar31,uVar22));
  auVar18[10] = cVar27;
  auVar18._0_10_ = Var17;
  auVar18[0xb] = (char)(uVar31 >> 0x18);
  auVar19[0xc] = cVar28;
  auVar19._0_12_ = auVar18;
  auVar19[0xd] = (char)(uVar31 >> 0x28);
  sVar11 = (short)uVar22;
  cVar1 = (0 < sVar11) * (sVar11 < 0x100) * (char)uVar22 - (0xff < sVar11);
  sVar11 = (short)(uVar22 >> 0x10);
  uVar12 = (ushort)(uVar22 >> 0x20);
  bVar2 = (uVar12 != 0) * (uVar12 < 0x100) * (char)(uVar22 >> 0x20) - (0xff < uVar12);
  sVar13 = (short)((unkuint10)Var17 >> 0x40);
  cVar29 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar31 - (0xff < sVar13);
  sVar14 = auVar18._10_2_;
  sVar13 = auVar19._12_2_;
  bVar3 = (0 < sVar13) * (sVar13 < 0x100) * cVar28 - (0xff < sVar13);
  sVar13 = auVar30._0_2_;
  cVar28 = (0 < sVar13) * (sVar13 < 0x100) * auVar30[0] - (0xff < sVar13);
  sVar15 = auVar30._2_2_;
  sVar13 = auVar30._4_2_;
  cVar4 = (0 < sVar13) * (sVar13 < 0x100) * auVar30[4] - (0xff < sVar13);
  sVar16 = auVar30._6_2_;
  uVar34 = uVar25 >> 0x28 & uVar35;
  uVar37 = (ulong)(((unkuint9)CONCAT13(uVar26,input.lower._4_3_) << 0x28) >> 0x28) & uVar38;
  uVar31 = uVar25 >> 0x38 & uVar35;
  uVar25 = (ulong)(((unkuint9)CONCAT11(uVar26,input.lower._6_1_) << 0x38) >> 0x38) & uVar38;
  uVar12 = (ushort)uVar31;
  bVar5 = (uVar12 != 0) * (uVar12 < 0x100) * (char)uVar31 - (0xff < uVar12);
  sVar13 = (short)uVar25;
  bVar6 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar25 - (0xff < sVar13);
  sVar13 = (short)uVar34;
  cVar7 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar34 - (0xff < sVar13);
  uVar12 = (ushort)(uVar34 >> 0x10);
  uVar12 = CONCAT11((uVar12 != 0) * (uVar12 < 0x100) * (char)(uVar34 >> 0x10) - (0xff < uVar12),
                    cVar7);
  auVar32._0_12_ = ZEXT212(uVar12) << 0x40;
  sVar13 = (short)uVar37;
  cVar8 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar37 - (0xff < sVar13);
  auVar32[0xc] = cVar8;
  sVar13 = (short)(uVar37 >> 0x10);
  auVar32[0xd] = (0 < sVar13) * (sVar13 < 0x100) * (char)(uVar37 >> 0x10) - (0xff < sVar13);
  sVar13 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < sVar11),cVar1
                   );
  sVar24 = CONCAT11((0 < sVar14) * (sVar14 < 0x100) * cVar27 - (0xff < sVar14),cVar29);
  sVar14 = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * auVar30[2] - (0xff < sVar15),cVar28);
  bVar5 = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
  bVar6 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
  bVar9 = (0 < (short)uVar12) * ((short)uVar12 < 0x100) * cVar7 - (0xff < (short)uVar12);
  sVar11 = auVar32._12_2_;
  bVar10 = (0 < sVar11) * (sVar11 < 0x100) * cVar8 - (0xff < sVar11);
  cVar1 = (0 < sVar13) * (sVar13 < 0x100) * cVar1 - (0xff < sVar13);
  sVar11 = CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),cVar1);
  cVar29 = (0 < sVar24) * (sVar24 < 0x100) * cVar29 - (0xff < sVar24);
  uVar23 = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),CONCAT12(cVar29,sVar11))
  ;
  cVar28 = (0 < sVar14) * (sVar14 < 0x100) * cVar28 - (0xff < sVar14);
  sVar13 = (short)(CONCAT13((0 < sVar16) * (sVar16 < 0x100) * auVar30[6] - (0xff < sVar16),
                            CONCAT12(cVar4,sVar14)) >> 0x10);
  PVar39.bytes[1] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
  PVar39.bytes[0] = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
  PVar39.bytes[2] = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
  PVar39.bytes[3] = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
  PVar39.bytes[4] = (0 < sVar11) * (sVar11 < 0x100) * cVar1 - (0xff < sVar11);
  sVar11 = (short)((uint)uVar23 >> 0x10);
  PVar39.bytes[5] = (0 < sVar11) * (sVar11 < 0x100) * cVar29 - (0xff < sVar11);
  sVar11 = (short)(CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar4 - (0xff < sVar13),
                            CONCAT14(cVar28,uVar23)) >> 0x20);
  PVar39.bytes[6] = (0 < sVar11) * (sVar11 < 0x100) * cVar28 - (0xff < sVar11);
  PVar39.bytes[7] = '\0';
  auVar33._0_8_ = (ulong)this >> 8;
  auVar33._8_8_ = this;
  auVar33 = auVar33 & _DAT_003b43b0;
  uVar22 = (ulong)this >> 0x18 & uVar35;
  uVar31 = (ulong)this >> 0x10 & uVar38;
  cVar27 = (char)(uVar31 >> 0x10);
  cVar29 = (char)(uVar31 >> 0x20);
  Var17 = CONCAT19((char)(uVar31 >> 8),CONCAT18((char)uVar31,uVar22));
  auVar20[10] = cVar27;
  auVar20._0_10_ = Var17;
  auVar20[0xb] = (char)(uVar31 >> 0x18);
  auVar21[0xc] = cVar29;
  auVar21._0_12_ = auVar20;
  auVar21[0xd] = (char)(uVar31 >> 0x28);
  sVar11 = (short)uVar22;
  cVar1 = (0 < sVar11) * (sVar11 < 0x100) * (char)uVar22 - (0xff < sVar11);
  sVar11 = (short)(uVar22 >> 0x10);
  uVar12 = (ushort)(uVar22 >> 0x20);
  bVar2 = (uVar12 != 0) * (uVar12 < 0x100) * (char)(uVar22 >> 0x20) - (0xff < uVar12);
  sVar13 = (short)((unkuint10)Var17 >> 0x40);
  cVar4 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar31 - (0xff < sVar13);
  sVar14 = auVar20._10_2_;
  sVar13 = auVar21._12_2_;
  bVar3 = (0 < sVar13) * (sVar13 < 0x100) * cVar29 - (0xff < sVar13);
  sVar13 = auVar33._0_2_;
  cVar29 = (0 < sVar13) * (sVar13 < 0x100) * auVar33[0] - (0xff < sVar13);
  sVar15 = auVar33._2_2_;
  sVar13 = auVar33._4_2_;
  cVar28 = (0 < sVar13) * (sVar13 < 0x100) * auVar33[4] - (0xff < sVar13);
  sVar16 = auVar33._6_2_;
  uVar31 = (ulong)this >> 0x28 & uVar35;
  uVar25 = (ulong)(((unkuint9)(uint)((ulong)this >> 0x20) << 0x28) >> 0x28) & uVar38;
  uVar35 = (ulong)this >> 0x38 & uVar35;
  uVar38 = (ulong)(((unkuint9)(ushort)((ulong)this >> 0x30) << 0x38) >> 0x38) & uVar38;
  uVar12 = (ushort)uVar35;
  bVar5 = (uVar12 != 0) * (uVar12 < 0x100) * (char)uVar35 - (0xff < uVar12);
  sVar13 = (short)uVar38;
  bVar6 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar38 - (0xff < sVar13);
  sVar13 = (short)uVar31;
  cVar7 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar31 - (0xff < sVar13);
  uVar12 = (ushort)(uVar31 >> 0x10);
  uVar12 = CONCAT11((uVar12 != 0) * (uVar12 < 0x100) * (char)(uVar31 >> 0x10) - (0xff < uVar12),
                    cVar7);
  auVar36._0_12_ = ZEXT212(uVar12) << 0x40;
  sVar13 = (short)uVar25;
  cVar8 = (0 < sVar13) * (sVar13 < 0x100) * (char)uVar25 - (0xff < sVar13);
  auVar36[0xc] = cVar8;
  sVar13 = (short)(uVar25 >> 0x10);
  auVar36[0xd] = (0 < sVar13) * (sVar13 < 0x100) * (char)(uVar25 >> 0x10) - (0xff < sVar13);
  sVar13 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * (char)(uVar22 >> 0x10) - (0xff < sVar11),cVar1
                   );
  sVar24 = CONCAT11((0 < sVar14) * (sVar14 < 0x100) * cVar27 - (0xff < sVar14),cVar4);
  sVar14 = CONCAT11((0 < sVar15) * (sVar15 < 0x100) * auVar33[2] - (0xff < sVar15),cVar29);
  bVar5 = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
  bVar6 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
  bVar9 = (0 < (short)uVar12) * ((short)uVar12 < 0x100) * cVar7 - (0xff < (short)uVar12);
  sVar11 = auVar36._12_2_;
  bVar10 = (0 < sVar11) * (sVar11 < 0x100) * cVar8 - (0xff < sVar11);
  cVar1 = (0 < sVar13) * (sVar13 < 0x100) * cVar1 - (0xff < sVar13);
  sVar11 = CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),cVar1);
  cVar4 = (0 < sVar24) * (sVar24 < 0x100) * cVar4 - (0xff < sVar24);
  uVar23 = CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),CONCAT12(cVar4,sVar11));
  cVar29 = (0 < sVar14) * (sVar14 < 0x100) * cVar29 - (0xff < sVar14);
  sVar13 = (short)(CONCAT13((0 < sVar16) * (sVar16 < 0x100) * auVar33[6] - (0xff < sVar16),
                            CONCAT12(cVar28,sVar14)) >> 0x10);
  PVar39.bytes[9] = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
  PVar39.bytes[8] = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
  PVar39.bytes[10] = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
  PVar39.bytes[0xb] = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
  PVar39.bytes[0xc] = (0 < sVar11) * (sVar11 < 0x100) * cVar1 - (0xff < sVar11);
  sVar11 = (short)((uint)uVar23 >> 0x10);
  PVar39.bytes[0xd] = (0 < sVar11) * (sVar11 < 0x100) * cVar4 - (0xff < sVar11);
  sVar11 = (short)(CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar28 - (0xff < sVar13),
                            CONCAT14(cVar29,uVar23)) >> 0x20);
  PVar39.bytes[0xe] = (0 < sVar11) * (sVar11 < 0x100) * cVar29 - (0xff < sVar11);
  PVar39.bytes[0xf] = '\0';
  return (ParquetUUIDTargetType)PVar39.bytes;
}

Assistant:

static TGT Operation(SRC input) {
		TGT result;
		uint64_t high_bytes = input.upper ^ (int64_t(1) << 63);
		uint64_t low_bytes = input.lower;
		for (idx_t i = 0; i < sizeof(uint64_t); i++) {
			auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
			result.bytes[i] = (high_bytes >> shift_count) & 0xFF;
		}
		for (idx_t i = 0; i < sizeof(uint64_t); i++) {
			auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
			result.bytes[sizeof(uint64_t) + i] = (low_bytes >> shift_count) & 0xFF;
		}
		return result;
	}